

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void __thiscall
CPP::WriteInitialization::Item::addSetter
          (Item *this,QString *setter,QString *directive,bool translatable)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  byte in_CL;
  QString *in_RDX;
  QString *in_RSI;
  QMultiMap<QString,_QString> *in_RDI;
  TemporaryVariableGeneratorPolicy newPolicy;
  QString *in_stack_ffffffffffffffd0;
  QSet<QString> *in_stack_ffffffffffffffd8;
  QMultiMap<QString,_QString> *this_00;
  
  this_00 = in_RDI;
  bVar1 = QString::isNull((QString *)0x13f5a2);
  iVar2 = 2;
  if (bVar1) {
    iVar2 = 3;
  }
  if ((in_CL & 1) == 0) {
    iVar3 = QMultiMap<QString,_QString>::insert(this_00,in_RSI,in_RDX);
    if (iVar2 == 2) {
      QSet<QString>::operator<<(in_stack_ffffffffffffffd8,(QString *)iVar3.i._M_node);
    }
    if (*(int *)&in_RDI[2].d.d.ptr < iVar2) {
      *(int *)&in_RDI[2].d.d.ptr = iVar2;
    }
  }
  else {
    iVar3 = QMultiMap<QString,_QString>::insert(this_00,in_RSI,in_RDX);
    if (iVar2 == 2) {
      QSet<QString>::operator<<((QSet<QString> *)iVar3.i._M_node,in_stack_ffffffffffffffd0);
    }
    if (*(int *)&in_RDI[5].d.d.ptr < iVar2) {
      *(int *)&in_RDI[5].d.d.ptr = iVar2;
    }
  }
  return;
}

Assistant:

void WriteInitialization::Item::addSetter(const QString &setter, const QString &directive, bool translatable)
{
    const ItemData::TemporaryVariableGeneratorPolicy newPolicy = directive.isNull() ? ItemData::Generate : ItemData::GenerateWithMultiDirective;
    if (translatable) {
        m_retranslateUiData.setters.insert(directive, setter);
        if (ItemData::GenerateWithMultiDirective == newPolicy)
            m_retranslateUiData.directives << directive;
        if (m_retranslateUiData.policy < newPolicy)
            m_retranslateUiData.policy = newPolicy;
    } else {
        m_setupUiData.setters.insert(directive, setter);
        if (ItemData::GenerateWithMultiDirective == newPolicy)
            m_setupUiData.directives << directive;
        if (m_setupUiData.policy < newPolicy)
            m_setupUiData.policy = newPolicy;
    }
}